

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphContigger.cc
# Opt level: O2

void __thiscall
GraphContigger::pop_all_error_bubbles
          (GraphContigger *this,GraphEditor *ge,PairedReadsDatastore *peds,int size,bool apply)

{
  ulong uVar1;
  bool bVar2;
  uint64_t uVar3;
  ostream *poVar4;
  pointer this_00;
  GraphContigger *this_01;
  ulong uVar5;
  ulong uVar6;
  int local_84;
  int local_80;
  NodeView *local_60 [3];
  _Vector_base<NodeView,_std::allocator<NodeView>_> local_48;
  
  local_80 = 0;
  DistanceGraph::get_all_nodeviews
            ((vector<NodeView,_std::allocator<NodeView>_> *)&local_48,*(DistanceGraph **)this,false,
             true);
  local_84 = 0;
  for (this_00 = local_48._M_impl.super__Vector_impl_data._M_start;
      this_00 != local_48._M_impl.super__Vector_impl_data._M_finish; this_00 = this_00 + 1) {
    uVar3 = NodeView::size(this_00);
    if (uVar3 <= (ulong)(long)size) {
      bVar2 = NodeView::is_bubble_side(this_00);
      if (bVar2) {
        uVar1 = this_00->id;
        NodeView::parallels((vector<NodeView,_std::allocator<NodeView>_> *)local_60,this_00);
        uVar6 = -uVar1;
        if (0 < (long)uVar1) {
          uVar6 = uVar1;
        }
        uVar1 = local_60[0]->id;
        uVar5 = -uVar1;
        if (0 < (long)uVar1) {
          uVar5 = uVar1;
        }
        std::_Vector_base<NodeView,_std::allocator<NodeView>_>::~_Vector_base
                  ((_Vector_base<NodeView,_std::allocator<NodeView>_> *)local_60);
        if (uVar6 < uVar5) {
          this_01 = (GraphContigger *)local_60;
          NodeView::parallels((vector<NodeView,_std::allocator<NodeView>_> *)local_60,this_00);
          bVar2 = pop_error_bubbble(this_01,ge,this_00,local_60[0],peds,5,10,10,false);
          local_84 = local_84 + 1;
          std::_Vector_base<NodeView,_std::allocator<NodeView>_>::~_Vector_base
                    ((_Vector_base<NodeView,_std::allocator<NodeView>_> *)local_60);
          local_80 = local_80 + (uint)bVar2;
        }
      }
    }
  }
  std::_Vector_base<NodeView,_std::allocator<NodeView>_>::~_Vector_base(&local_48);
  poVar4 = (ostream *)std::ostream::operator<<(&std::cout,local_80);
  poVar4 = std::operator<<(poVar4,"/");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_84);
  poVar4 = std::operator<<(poVar4," canonical repeats solved!");
  std::endl<char,std::char_traits<char>>(poVar4);
  if (apply) {
    GraphEditor::apply_all(ge);
    SequenceDistanceGraph::join_all_unitigs(*(SequenceDistanceGraph **)this);
  }
  return;
}

Assistant:

void GraphContigger::pop_all_error_bubbles(GraphEditor &ge, PairedReadsDatastore &peds, int size, bool apply){
    int total=0;
    int solved=0;
    for (auto &nv: ws.sdg.get_all_nodeviews()){
        if (nv.size()<=size and nv.is_bubble_side() and std::abs(nv.node_id())<std::abs(nv.parallels()[0].node_id())) {
            total++;
            if (pop_error_bubbble(ge, nv, nv.parallels()[0], peds)){
                solved++;
            }
        }
    }
    std::cout << solved << "/" << total << " canonical repeats solved!" << std::endl;
    if (apply) {
        ge.apply_all();
        ws.sdg.join_all_unitigs();
    }
}